

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O0

void __thiscall Client::~Client(Client *this)

{
  Client *this_local;
  
  std::__cxx11::string::~string((string *)&this->_svr_ip);
  Epoll::~Epoll(&this->_epoll);
  return;
}

Assistant:

Client(const std::string& ip, const int port):
        _epoll(), _sock_fd(-1), _svr_ip(ip), _svr_port(port), 
        _stdin2sock(), _sock2stdout(), _stdineof(false)
    {

    }